

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O0

int __thiscall
yactfr::internal::PseudoVarWithIntRangesType::clone
          (PseudoVarWithIntRangesType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,
          ...)

{
  optional<yactfr::internal::PseudoDataLoc> *__args_1;
  undefined1 local_68 [24];
  vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
  local_50;
  PseudoNamedDts local_38;
  undefined1 local_20 [16];
  PseudoVarWithIntRangesType *this_local;
  
  local_20._8_8_ = __fn;
  this_local = this;
  __args_1 = PseudoVarType::pseudoSelLoc((PseudoVarType *)__fn);
  PseudoVarType::_clonePseudoOpts(&local_38,(PseudoVarType *)__fn);
  std::
  vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
  ::vector((vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
            *)(local_68 + 0x18),
           (vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
            *)(__fn + 0xc0));
  WithAttrsMixin::attrs((WithAttrsMixin *)(__fn + 0x30));
  tryCloneAttrs((MapItem *)local_68);
  PseudoDt::loc((PseudoDt *)__fn);
  std::
  make_unique<yactfr::internal::PseudoVarWithIntRangesType,boost::optional<yactfr::internal::PseudoDataLoc>const&,std::vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,std::default_delete<yactfr::internal::PseudoNamedDt>>,std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,std::default_delete<yactfr::internal::PseudoNamedDt>>>>,std::vector<yactfr::IntegerRangeSet<unsigned_long_long,false>,std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,false>>>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,yactfr::TextLocation_const&>
            ((optional<yactfr::internal::PseudoDataLoc> *)local_20,
             (vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
              *)__args_1,
             (vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
              *)&local_38,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (local_68 + 0x18),(TextLocation *)local_68);
  std::unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>::
  unique_ptr<yactfr::internal::PseudoVarWithIntRangesType,std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>,void>
            ((unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>
              *)this,(unique_ptr<yactfr::internal::PseudoVarWithIntRangesType,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
                      *)local_20);
  std::
  unique_ptr<yactfr::internal::PseudoVarWithIntRangesType,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
  ::~unique_ptr((unique_ptr<yactfr::internal::PseudoVarWithIntRangesType,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
                 *)local_20);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_68);
  std::
  vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
  ::~vector((vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
             *)(local_68 + 0x18));
  std::
  vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
  ::~vector(&local_38);
  return (int)this;
}

Assistant:

PseudoDt::Up PseudoVarWithIntRangesType::clone() const
{
    return std::make_unique<PseudoVarWithIntRangesType>(this->pseudoSelLoc(),
                                                        this->_clonePseudoOpts(),
                                                        RangeSets {_rangeSets},
                                                        tryCloneAttrs(this->attrs()),
                                                        this->loc());
}